

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

void __thiscall Input::Input(Input *this)

{
  uint local_18;
  uint local_14;
  uint i_1;
  uint i;
  Input *this_local;
  
  for (local_14 = 0; local_14 < 0x15c; local_14 = local_14 + 1) {
    this->keys[local_14] = false;
    this->keysUp[local_14] = false;
    this->keysDown[local_14] = false;
  }
  for (local_18 = 0; local_18 < 7; local_18 = local_18 + 1) {
    this->mouse[local_18] = false;
    this->mouseUp[local_18] = false;
    this->mouseDown[local_18] = false;
  }
  this->mouseX = 0.0;
  this->mouseY = 0.0;
  return;
}

Assistant:

Input::Input()
{
	for (unsigned int i = 0; i< GLFW_KEY_LAST; i++)
	{
		keys[i] = false;
		keysUp[i] = false;
		keysDown[i] = false;
	}
	for (unsigned int i = 0; i< GLFW_MOUSE_BUTTON_LAST; i++)
	{
		mouse[i] = false;
		mouseUp[i] = false;
		mouseDown[i] = false;
	}
	
	mouseX = 0;
	mouseY = 0;
}